

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O0

Action __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
::acceptVisitor(CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
                *this,SyntaxVisitor *visitor)

{
  SyntaxTree *this_00;
  Action AVar1;
  Action action;
  ExtGNU_AsmOperandSyntax *node;
  CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
  *it;
  SyntaxVisitor *visitor_local;
  CoreSyntaxNodeList<psy::C::ExtGNU_AsmOperandSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax_*>_>
  *this_local;
  
  node = (ExtGNU_AsmOperandSyntax *)this;
  while( true ) {
    if (node == (ExtGNU_AsmOperandSyntax *)0x0) {
      return Visit;
    }
    this_00 = (node->super_SyntaxNode).tree_;
    if ((this_00 != (SyntaxTree *)0x0) &&
       (AVar1 = C::SyntaxNode::acceptVisitor((SyntaxNode *)this_00,visitor), AVar1 == Quit)) break;
    node = *(ExtGNU_AsmOperandSyntax **)&(node->super_SyntaxNode).kind_;
  }
  return Quit;
}

Assistant:

virtual SyntaxVisitor::Action acceptVisitor(SyntaxVisitor* visitor) override
    {
        for (auto it = this; it; it = it->next) {
            SyntaxNodeT node = static_cast<SyntaxNodeT>(it->value);
            if (node) {
                auto action = node->acceptVisitor(visitor);
                if (action == SyntaxVisitor::Action::Quit)
                    return action;
            }
        }
        return SyntaxVisitor::Action::Visit;
    }